

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

coda_type_special * coda_type_complex_new(coda_format format)

{
  coda_type_special *type;
  coda_type_special *pcStack_10;
  coda_format format_local;
  
  pcStack_10 = (coda_type_special *)malloc(0x58);
  if (pcStack_10 == (coda_type_special *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x58,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xa14);
    pcStack_10 = (coda_type_special *)0x0;
  }
  else {
    pcStack_10->format = format;
    pcStack_10->retain_count = 0;
    pcStack_10->type_class = coda_special_class;
    pcStack_10->read_type = coda_native_type_not_available;
    pcStack_10->name = (char *)0x0;
    pcStack_10->description = (char *)0x0;
    pcStack_10->bit_size = -1;
    pcStack_10->size_expr = (coda_expression *)0x0;
    pcStack_10->attributes = (coda_type_record *)0x0;
    pcStack_10->special_type = coda_special_complex;
    pcStack_10->base_type = (coda_type *)0x0;
    pcStack_10->unit = (char *)0x0;
    pcStack_10->value_expr = (coda_expression *)0x0;
  }
  return pcStack_10;
}

Assistant:

coda_type_special *coda_type_complex_new(coda_format format)
{
    coda_type_special *type;

    type = (coda_type_special *)malloc(sizeof(coda_type_special));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_type_special), __FILE__, __LINE__);
        return NULL;
    }
    type->format = format;
    type->retain_count = 0;
    type->type_class = coda_special_class;
    type->read_type = coda_native_type_not_available;
    type->name = NULL;
    type->description = NULL;
    type->bit_size = -1;
    type->size_expr = NULL;
    type->attributes = NULL;
    type->special_type = coda_special_complex;
    type->base_type = NULL;
    type->unit = NULL;
    type->value_expr = NULL;

    return type;
}